

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,double testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  pointer ppcVar1;
  cmCTest *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  cmsysProcess *cp;
  SaveRestoreEnvironment *pSVar7;
  uint uVar8;
  ulong uVar9;
  char *__s1;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  double dVar13;
  cmProcessOutput processOutput;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  int length;
  vector<char,_std::allocator<char>_> tempOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  char *data;
  cmCTest *local_8d8;
  undefined8 uStack_8d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8c8;
  string *local_8c0;
  _Vector_base<char,_std::allocator<char>_> local_8b8;
  string local_8a0;
  ostringstream msg;
  string strdata;
  ostringstream cmCTestLog_msg;
  string local_588 [1120];
  double local_128;
  string *local_b0;
  string *local_a8;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  dVar11 = GetRemainingTimeAllowed(this);
  dVar11 = dVar11 + -120.0;
  dVar12 = this->TimeOut;
  dVar13 = dVar12;
  if (dVar11 <= dVar12) {
    dVar13 = dVar11;
  }
  local_8d8 = (cmCTest *)
              (~-(ulong)(0.0 < dVar12) & (ulong)dVar11 | (ulong)dVar13 & -(ulong)(0.0 < dVar12));
  uStack_8d0 = extraout_XMM0_Qb;
  if ((0.0 < testTimeOut) && (dVar12 = GetRemainingTimeAllowed(this), testTimeOut < dVar12)) {
    uStack_8d0 = 0;
    local_8d8 = (cmCTest *)testTimeOut;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Test timeout computed to be: ");
  dVar12 = (double)(~-(ulong)(0.0 < (double)local_8d8) & 0x3ff0000000000000 |
                   (ulong)local_8d8 & -(ulong)(0.0 < (double)local_8d8));
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  std::operator<<(poVar5,"\n");
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x44a,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator *)&strdata);
  psVar6 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar2 = cmsys::SystemTools::SameFile((string *)&cmCTestLog_msg,psVar6);
  if (bVar2) {
    bVar2 = this->ForceNewCTestProcess;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar2 == false) {
      cmCTest((cmCTest *)&cmCTestLog_msg);
      std::__cxx11::string::_M_assign(local_588);
      local_8d8 = this;
      local_8c8 = environment;
      local_8c0 = output;
      local_128 = dVar12;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&strdata);
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar8 = 0;
      local_b0 = &strdata;
      local_a8 = &strdata;
      while( true ) {
        uVar9 = (ulong)uVar8;
        ppcVar1 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar9)
        break;
        __s1 = ppcVar1[uVar9];
        if (__s1 != (char *)0x0) {
          iVar3 = strcmp(__s1,"--build-generator");
          if ((0.0 < dVar12) && (iVar3 == 0)) {
            std::__cxx11::string::string((string *)&msg,"--test-timeout",(allocator *)&local_900);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &tempOutput,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
            std::__cxx11::string::~string((string *)&msg);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            std::ostream::_M_insert<double>(dVar12);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &tempOutput,&local_900);
            std::__cxx11::string::~string((string *)&local_900);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
            __s1 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
          }
          std::__cxx11::string::string((string *)&msg,__s1,(allocator *)&local_900);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &tempOutput,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
          std::__cxx11::string::~string((string *)&msg);
        }
        uVar8 = uVar8 + 1;
      }
      if (log != (ostream *)0x0) {
        poVar5 = std::operator<<(log,"* Run internal CTest");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      psVar6 = local_8c0;
      this_00 = local_8d8;
      saveEnv.x_ = (SaveRestoreEnvironment *)0x0;
      if (bVar10) {
        pSVar7 = (SaveRestoreEnvironment *)operator_new(0x18);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar7);
        ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&saveEnv,pSVar7);
        cmSystemTools::AppendEnv(local_8c8);
      }
      iVar3 = Run((cmCTest *)&cmCTestLog_msg,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tempOutput,psVar6);
      *retVal = iVar3;
      if (psVar6 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)psVar6);
        std::__cxx11::string::~string((string *)&msg);
        if (log != (ostream *)0x0) {
          std::operator<<(log,(string *)psVar6);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar5 = std::operator<<((ostream *)&msg,"Internal cmCTest object used to run test.");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this_00,4,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x479,local_900._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_900);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
      }
      ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&saveEnv);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tempOutput);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strdata);
      ~cmCTest((cmCTest *)&cmCTestLog_msg);
      return 4;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    std::__cxx11::string::assign((char *)output);
  }
  saveEnv.x_ = (SaveRestoreEnvironment *)0x0;
  if (bVar10) {
    pSVar7 = (SaveRestoreEnvironment *)operator_new(0x18);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar7);
    ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&saveEnv,pSVar7);
    cmSystemTools::AppendEnv(environment);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Command is: ");
  poVar5 = std::operator<<(poVar5,*(argv->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x48b,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,dVar12);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  while (iVar3 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar3 != 0) {
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::insert<char*,void>
                ((vector<char,std::allocator<char>> *)&tempOutput,
                 (const_iterator)
                 tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,data,data + length);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    _msg = strdata._M_dataplus._M_p;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&msg);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x49d,_msg,false);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,(long)strdata._M_dataplus._M_p);
    }
  }
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  local_8a0._M_string_length = 0;
  local_8a0.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_8a0,&strdata,0);
  std::__cxx11::string::~string((string *)&local_8a0);
  if (strdata._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    _msg = strdata._M_dataplus._M_p;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&msg);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4a5,_msg,false);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,(long)strdata._M_dataplus._M_p);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_8b8,&tempOutput);
  cmProcessOutput::DecodeText
            (&processOutput,(vector<char,_std::allocator<char>_> *)&local_8b8,&tempOutput,0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_8b8);
  if ((output != (string *)0x0) &&
     (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"-- Process completed");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x4b1,_msg,false);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 1) {
    std::__cxx11::string::string
              ((string *)&msg,"\n*** ERROR executing: ",(allocator *)&cmCTestLog_msg);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)&msg);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4cd,local_900._M_dataplus._M_p,false);
  }
  else {
    if (iVar3 != 2) {
      if (iVar3 == 4) {
        iVar4 = cmsysProcess_GetExitValue(cp);
        *retVal = iVar4;
        if ((iVar4 != 0) && (this->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&tempOutput);
        }
      }
      goto LAB_002df443;
    }
    if (this->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,&tempOutput);
    }
    iVar4 = cmsysProcess_GetExitException(cp);
    *retVal = iVar4;
    std::__cxx11::string::string
              ((string *)&msg,"\n*** Exception executing: ",(allocator *)&cmCTestLog_msg);
    cmsysProcess_GetExceptionString(cp);
    std::__cxx11::string::append((char *)&msg);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4c5,local_900._M_dataplus._M_p,false);
  }
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&msg);
LAB_002df443:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&saveEnv);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  return iVar3;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, double testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  double timeout = this->GetRemainingTimeAllowed() - 120;
  if (this->TimeOut > 0 && this->TimeOut < timeout) {
    timeout = this->TimeOut;
  }
  if (testTimeOut > 0 && testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= 0) {
    timeout = 1;
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: " << timeout << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->ForceNewCTestProcess) {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (unsigned int i = 0; i < argv.size(); ++i) {
      if (argv[i]) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(argv[i], "--build-generator") == 0 && timeout > 0) {
          args.push_back("--test-timeout");
          std::ostringstream msg;
          msg << timeout;
          args.push_back(msg.str());
        }
        args.push_back(argv[i]);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    CM_AUTO_PTR<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    *output = "";
  }

  CM_AUTO_PTR<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      tempOutput.insert(tempOutput.end(), data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(&*tempOutput.begin(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "-- Process completed"
               << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl
                                                    << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl
                                                    << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}